

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderMaxOutputVerticesTest::iterate(GeometryShaderMaxOutputVerticesTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  qpTestResult testResult;
  char *description;
  GLint max_output_vertices;
  GLchar *geometry_shader_invalid_parts [3];
  string valid_output_vertices_string;
  string invalid_output_vertices_string;
  GLchar *geometry_shader_valid_parts [3];
  stringstream stream_invalid;
  undefined1 local_4a0 [376];
  undefined1 local_328 [384];
  stringstream stream_valid;
  undefined1 local_198 [376];
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported != false) {
    iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    valid_output_vertices_string._M_dataplus._M_p = (pointer)&valid_output_vertices_string.field_2;
    valid_output_vertices_string._M_string_length = 0;
    invalid_output_vertices_string._M_dataplus._M_p =
         (pointer)&invalid_output_vertices_string.field_2;
    invalid_output_vertices_string._M_string_length = 0;
    valid_output_vertices_string.field_2._M_local_buf[0] = '\0';
    invalid_output_vertices_string.field_2._M_local_buf[0] = '\0';
    (**(code **)(CONCAT44(extraout_var,iVar4) + 0x868))
              ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES,
               &max_output_vertices);
    err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
    glu::checkError(err,"glGetIntegerv() call failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x7e4);
    std::__cxx11::stringstream::stringstream((stringstream *)&stream_valid);
    std::ostream::operator<<(local_198,max_output_vertices);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=
              ((string *)&valid_output_vertices_string,(string *)&stream_invalid);
    std::__cxx11::string::~string((string *)&stream_invalid);
    std::__cxx11::stringstream::stringstream((stringstream *)&stream_invalid);
    std::ostream::operator<<(local_4a0,max_output_vertices + 1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&invalid_output_vertices_string,(string *)local_328);
    std::__cxx11::string::~string((string *)local_328);
    geometry_shader_valid_parts[0] =
         "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\n// definition of NUMBER_OF_POINTS goes here\n#define NUMBER_OF_POINTS "
    ;
    geometry_shader_valid_parts[1] = valid_output_vertices_string._M_dataplus._M_p;
    geometry_shader_valid_parts[2] =
         "u\n\nlayout(points)                                in;\nlayout(points, max_vertices=NUMBER_OF_POINTS) out;\n\nvoid main()\n{\n    int index = 0;\n\n    for (uint point = 0u; point < NUMBER_OF_POINTS; ++point)\n    {\n        EmitVertex();\n        EndPrimitive();\n    }\n\n}\n"
    ;
    geometry_shader_invalid_parts[0] =
         "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\n// definition of NUMBER_OF_POINTS goes here\n#define NUMBER_OF_POINTS "
    ;
    geometry_shader_invalid_parts[1] = invalid_output_vertices_string._M_dataplus._M_p;
    geometry_shader_invalid_parts[2] =
         "u\n\nlayout(points)                                in;\nlayout(points, max_vertices=NUMBER_OF_POINTS) out;\n\nvoid main()\n{\n    int index = 0;\n\n    for (uint point = 0u; point < NUMBER_OF_POINTS; ++point)\n    {\n        EmitVertex();\n        EndPrimitive();\n    }\n\n}\n"
    ;
    bVar2 = TestCaseBase::doesProgramBuild
                      (&this->super_TestCaseBase,1,&m_fragment_shader_code,3,
                       geometry_shader_valid_parts,1,&m_vertex_shader_code);
    testResult = QP_TEST_RESULT_FAIL;
    bVar3 = TestCaseBase::doesProgramBuild
                      (&this->super_TestCaseBase,1,&m_fragment_shader_code,3,
                       geometry_shader_invalid_parts,1,&m_vertex_shader_code);
    if (bVar2 && !bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      if (!bVar2) {
        local_328._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_328 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "Failed to build valid program! GS::max_vertices set to MAX_GEOMETRY_OUTPUT_VERTICES.\n"
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      description = "Fail";
      if (bVar3) {
        local_328._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_328 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "Build of invalid program was successful! GS::max_vertices set to MAX_GEOMETRY_OUTPUT_VERTICES + 1.\n"
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
               description);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream_invalid);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream_valid);
    std::__cxx11::string::~string((string *)&invalid_output_vertices_string);
    std::__cxx11::string::~string((string *)&valid_output_vertices_string);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Geometry shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
             ,0x7d8);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderMaxOutputVerticesTest::iterate()
{
	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get maximum number of output vertices and prepare strings */
	glw::GLint  max_output_vertices;
	std::string valid_output_vertices_string;
	std::string invalid_output_vertices_string;

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES, &max_output_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT pname");

	std::stringstream stream_valid;
	stream_valid << max_output_vertices;
	valid_output_vertices_string = stream_valid.str();

	std::stringstream stream_invalid;
	stream_invalid << max_output_vertices + 1;
	invalid_output_vertices_string = stream_invalid.str();

	/* Geometry shader parts */
	const glw::GLchar* geometry_shader_valid_parts[] = { m_geometry_shader_code_preamble,
														 valid_output_vertices_string.c_str(),
														 m_geometry_shader_code_body };

	const glw::GLchar* geometry_shader_invalid_parts[] = { m_geometry_shader_code_preamble,
														   invalid_output_vertices_string.c_str(),
														   m_geometry_shader_code_body };

	/* Try to build programs */
	bool does_valid_build =
		doesProgramBuild(1, &m_fragment_shader_code, 3, geometry_shader_valid_parts, 1, &m_vertex_shader_code);

	bool does_invalid_build =
		doesProgramBuild(1, &m_fragment_shader_code, 3, geometry_shader_invalid_parts, 1, &m_vertex_shader_code);

	/* Verify results */
	if ((true == does_valid_build) && (false == does_invalid_build))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (true != does_valid_build)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Failed to build valid program! GS::max_vertices "
														   "set to MAX_GEOMETRY_OUTPUT_VERTICES.\n"
							   << tcu::TestLog::EndMessage;
		}

		if (false != does_invalid_build)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Build of invalid program was successful! GS::max_vertices "
														   "set to MAX_GEOMETRY_OUTPUT_VERTICES + 1.\n"
							   << tcu::TestLog::EndMessage;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}